

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum-dtoa.cpp
# Opt level: O1

void __thiscall
icu_63::double_conversion::BignumDtoa
          (double_conversion *this,double v,BignumDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  long lVar1;
  double dVar2;
  uint16_t uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  BignumDtoaMode BVar8;
  int iVar9;
  uint uVar10;
  undefined4 in_register_00000014;
  char *pcVar11;
  ulong uVar12;
  Bignum *pBVar13;
  int *piVar14;
  ulong factor;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  float fVar18;
  Vector<char> buffer_00;
  Bignum numerator;
  Bignum denominator;
  Bignum delta_plus;
  Bignum delta_minus;
  int *in_stack_fffffffffffff738;
  Bignum local_890;
  Bignum local_678;
  Bignum local_460;
  Bignum local_248;
  
  pcVar11 = (char *)CONCAT44(in_register_00000014,requested_digits);
  piVar14 = buffer._8_8_;
  uVar16 = (uint)this;
  if (uVar16 == 1) {
    fVar18 = (float)v;
    uVar10 = (uint)fVar18 & 0x7fffff;
    bVar17 = ((uint)fVar18 & 0x7f800000) == 0;
    uVar15 = uVar10 + 0x800000;
    if (bVar17) {
      uVar15 = uVar10;
    }
    factor = (ulong)uVar15;
    iVar9 = -0x95;
    if (!bVar17) {
      iVar9 = ((uint)fVar18 >> 0x17 & 0xff) - 0x96;
    }
    if (uVar10 == 0) {
      bVar17 = ((uint)fVar18 & 0x7f000000) == 0;
      goto LAB_0027c5d6;
    }
LAB_0027c5c4:
    bVar17 = false;
  }
  else {
    uVar12 = (ulong)v & 0xfffffffffffff;
    bVar17 = ((ulong)v & 0x7ff0000000000000) == 0;
    factor = uVar12 + 0x10000000000000;
    if (bVar17) {
      factor = uVar12;
    }
    iVar9 = -0x432;
    if (!bVar17) {
      iVar9 = ((uint)((ulong)v >> 0x34) & 0x7ff) - 0x433;
    }
    if (uVar12 != 0) goto LAB_0027c5c4;
    bVar17 = ((ulong)v & 0x7fe0000000000000) == 0;
LAB_0027c5d6:
    bVar17 = !bVar17;
  }
  lVar1 = 0x3f;
  if ((factor & 0xfffffffffffff) != 0) {
    for (; (factor & 0xfffffffffffff) >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  iVar4 = (iVar9 + 0xb) - ((uint)lVar1 ^ 0x3f);
  if ((factor & 0x10000000000000) != 0) {
    iVar4 = iVar9;
  }
  dVar2 = ceil((double)(iVar4 + 0x34) * 0.30102999566398114 + -1e-10);
  uVar15 = (uint)dVar2;
  if ((uVar16 == 2) && ((int)mode < (int)~uVar15)) {
    *pcVar11 = '\0';
    *piVar14 = 0;
    *length = -mode;
    return;
  }
  Bignum::Bignum(&local_890);
  Bignum::Bignum(&local_678);
  Bignum::Bignum(&local_248);
  Bignum::Bignum(&local_460);
  if (iVar9 < 0) {
    if ((int)uVar15 < 0) {
      Bignum::AssignPowerUInt16(&local_890,10,-uVar15);
      if (uVar16 < 2) {
        Bignum::AssignBignum(&local_460,&local_890);
        Bignum::AssignBignum(&local_248,&local_890);
        Bignum::MultiplyByUInt64(&local_890,factor);
        pBVar13 = &local_678;
        Bignum::AssignUInt16(pBVar13,1);
        Bignum::ShiftLeft(pBVar13,-iVar9);
        Bignum::ShiftLeft(&local_890,1);
        iVar9 = 1;
      }
      else {
        Bignum::MultiplyByUInt64(&local_890,factor);
        pBVar13 = &local_678;
        Bignum::AssignUInt16(pBVar13,1);
        iVar9 = -iVar9;
      }
      goto LAB_0027c726;
    }
    Bignum::AssignUInt64(&local_890,factor);
    Bignum::AssignPowerUInt16(&local_678,10,uVar15);
    Bignum::ShiftLeft(&local_678,-iVar9);
    if (uVar16 < 2) {
      Bignum::ShiftLeft(&local_678,1);
      Bignum::ShiftLeft(&local_890,1);
      Bignum::AssignUInt16(&local_460,1);
      Bignum::AssignUInt16(&local_248,1);
    }
  }
  else {
    Bignum::AssignUInt64(&local_890,factor);
    Bignum::ShiftLeft(&local_890,iVar9);
    Bignum::AssignPowerUInt16(&local_678,10,uVar15);
    if (uVar16 < 2) {
      Bignum::ShiftLeft(&local_678,1);
      Bignum::ShiftLeft(&local_890,1);
      Bignum::AssignUInt16(&local_460,1);
      Bignum::ShiftLeft(&local_460,iVar9);
      pBVar13 = &local_248;
      Bignum::AssignUInt16(pBVar13,1);
LAB_0027c726:
      Bignum::ShiftLeft(pBVar13,iVar9);
    }
  }
  if (bVar17 && uVar16 < 2) {
    Bignum::ShiftLeft(&local_678,1);
    Bignum::ShiftLeft(&local_890,1);
    Bignum::ShiftLeft(&local_460,1);
  }
  iVar4 = Bignum::PlusCompare(&local_890,&local_460,&local_678);
  uVar10 = (uint)((factor & 1) == 0);
  iVar9 = -uVar10;
  if (iVar4 == iVar9 || SBORROW4(iVar4,iVar9) != (int)(iVar4 + uVar10) < 0) {
    *length = uVar15;
    Bignum::MultiplyByUInt32(&local_890,10);
    iVar9 = Bignum::Compare(&local_248,&local_460);
    Bignum::MultiplyByUInt32(&local_248,10);
    if (iVar9 == 0) {
      Bignum::AssignBignum(&local_460,&local_248);
    }
    else {
      Bignum::MultiplyByUInt32(&local_460,10);
    }
  }
  else {
    *length = uVar15 + 1;
  }
  if (uVar16 < 2) {
    iVar9 = Bignum::Compare(&local_248,&local_460);
    pBVar13 = &local_460;
    if (iVar9 == 0) {
      pBVar13 = &local_248;
    }
    *piVar14 = 0;
    uVar16 = (uint)factor & 1 ^ 1;
    iVar4 = -(uint)((factor & 1) == 0);
    do {
      uVar3 = Bignum::DivideModuloIntBignum(&local_890,&local_678);
      iVar5 = *piVar14;
      *piVar14 = iVar5 + 1;
      pcVar11[iVar5] = (char)uVar3 + '0';
      iVar5 = Bignum::Compare(&local_890,&local_248);
      iVar6 = Bignum::PlusCompare(&local_890,pBVar13,&local_678);
      if (iVar6 <= iVar4 && (int)uVar16 <= iVar5) {
        Bignum::MultiplyByUInt32(&local_890,10);
        Bignum::MultiplyByUInt32(&local_248,10);
        if (iVar9 != 0) {
          Bignum::MultiplyByUInt32(pBVar13,10);
        }
      }
      else if ((iVar5 < (int)uVar16) && (iVar4 < iVar6)) {
        iVar7 = Bignum::PlusCompare(&local_890,&local_890,&local_678);
        if (-1 < iVar7) {
          if ((iVar7 != 0) || ((pcVar11[(long)*piVar14 + -1] & 1U) != 0)) {
            pcVar11[(long)*piVar14 + -1] = pcVar11[(long)*piVar14 + -1] + 1;
          }
        }
      }
      else if ((int)uVar16 <= iVar5) {
        pcVar11[(long)*piVar14 + -1] = pcVar11[(long)*piVar14 + -1] + '\x01';
      }
    } while (iVar6 <= iVar4 && (int)uVar16 <= iVar5);
    goto LAB_0027ca2b;
  }
  if (uVar16 == 2) {
    BVar8 = -*length;
    if ((int)mode < (int)BVar8) {
      *length = -mode;
      *piVar14 = 0;
      goto LAB_0027ca2b;
    }
    if (BVar8 == mode) {
      Bignum::MultiplyByUInt32(&local_678,10);
      iVar9 = Bignum::PlusCompare(&local_890,&local_890,&local_678);
      if (iVar9 < 0) {
        *piVar14 = 0;
      }
      else {
        *pcVar11 = '1';
        *piVar14 = 1;
        *length = *length + 1;
      }
      goto LAB_0027ca2b;
    }
    mode = *length + mode;
  }
  else if (uVar16 != 3) {
    abort();
  }
  buffer_00._8_8_ = piVar14;
  buffer_00.start_ = pcVar11;
  GenerateCountedDigits(mode,length,&local_890,&local_678,buffer_00,in_stack_fffffffffffff738);
LAB_0027ca2b:
  pcVar11[*piVar14] = '\0';
  return;
}

Assistant:

void BignumDtoa(double v, BignumDtoaMode mode, int requested_digits,
                Vector<char> buffer, int* length, int* decimal_point) {
  ASSERT(v > 0);
  ASSERT(!Double(v).IsSpecial());
  uint64_t significand;
  int exponent;
  bool lower_boundary_is_closer;
  if (mode == BIGNUM_DTOA_SHORTEST_SINGLE) {
    float f = static_cast<float>(v);
    ASSERT(f == v);
    significand = Single(f).Significand();
    exponent = Single(f).Exponent();
    lower_boundary_is_closer = Single(f).LowerBoundaryIsCloser();
  } else {
    significand = Double(v).Significand();
    exponent = Double(v).Exponent();
    lower_boundary_is_closer = Double(v).LowerBoundaryIsCloser();
  }
  bool need_boundary_deltas =
      (mode == BIGNUM_DTOA_SHORTEST || mode == BIGNUM_DTOA_SHORTEST_SINGLE);

  bool is_even = (significand & 1) == 0;
  int normalized_exponent = NormalizedExponent(significand, exponent);
  // estimated_power might be too low by 1.
  int estimated_power = EstimatePower(normalized_exponent);

  // Shortcut for Fixed.
  // The requested digits correspond to the digits after the point. If the
  // number is much too small, then there is no need in trying to get any
  // digits.
  if (mode == BIGNUM_DTOA_FIXED && -estimated_power - 1 > requested_digits) {
    buffer[0] = '\0';
    *length = 0;
    // Set decimal-point to -requested_digits. This is what Gay does.
    // Note that it should not have any effect anyways since the string is
    // empty.
    *decimal_point = -requested_digits;
    return;
  }

  Bignum numerator;
  Bignum denominator;
  Bignum delta_minus;
  Bignum delta_plus;
  // Make sure the bignum can grow large enough. The smallest double equals
  // 4e-324. In this case the denominator needs fewer than 324*4 binary digits.
  // The maximum double is 1.7976931348623157e308 which needs fewer than
  // 308*4 binary digits.
  ASSERT(Bignum::kMaxSignificantBits >= 324*4);
  InitialScaledStartValues(significand, exponent, lower_boundary_is_closer,
                           estimated_power, need_boundary_deltas,
                           &numerator, &denominator,
                           &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^estimated_power.
  FixupMultiply10(estimated_power, is_even, decimal_point,
                  &numerator, &denominator,
                  &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^(decimal_point-1), and
  //  1 <= (numerator + delta_plus) / denominator < 10
  switch (mode) {
    case BIGNUM_DTOA_SHORTEST:
    case BIGNUM_DTOA_SHORTEST_SINGLE:
      GenerateShortestDigits(&numerator, &denominator,
                             &delta_minus, &delta_plus,
                             is_even, buffer, length);
      break;
    case BIGNUM_DTOA_FIXED:
      BignumToFixed(requested_digits, decimal_point,
                    &numerator, &denominator,
                    buffer, length);
      break;
    case BIGNUM_DTOA_PRECISION:
      GenerateCountedDigits(requested_digits, decimal_point,
                            &numerator, &denominator,
                            buffer, length);
      break;
    default:
      UNREACHABLE();
  }
  buffer[*length] = '\0';
}